

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O0

void Sym_ManPrintStats(Sym_Man_t *p)

{
  Sym_Man_t *p_local;
  
  printf("Total symm         = %8d.\n",(ulong)(uint)p->nPairsSymm);
  printf("Structural symm    = %8d.\n",(ulong)(uint)p->nPairsSymmStr);
  printf("Total non-sym      = %8d.\n",(ulong)(uint)p->nPairsNonSymm);
  printf("Total var pairs    = %8d.\n",(ulong)(uint)p->nPairsTotal);
  printf("Sat runs SAT       = %8d.\n",(ulong)(uint)p->nSatRunsSat);
  printf("Sat runs UNSAT     = %8d.\n",(ulong)(uint)p->nSatRunsUnsat);
  Abc_Print(1,"%s =","Structural  ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeStruct * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Simulation  ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeSim * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Matrix      ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeMatr * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Counting    ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeCount * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Fraiging    ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeFraig * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","SAT         ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeSat * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","TOTAL       ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeTotal * 1.0) / 1000000.0);
  return;
}

Assistant:

void Sym_ManPrintStats( Sym_Man_t * p )
{
//    printf( "Inputs = %5d. Outputs = %5d. Sim words = %5d.\n", 
//        Abc_NtkCiNum(p->pNtk), Abc_NtkCoNum(p->pNtk), p->nSimWords );
    printf( "Total symm         = %8d.\n", p->nPairsSymm );
    printf( "Structural symm    = %8d.\n", p->nPairsSymmStr );
    printf( "Total non-sym      = %8d.\n", p->nPairsNonSymm );
    printf( "Total var pairs    = %8d.\n", p->nPairsTotal );
    printf( "Sat runs SAT       = %8d.\n", p->nSatRunsSat );
    printf( "Sat runs UNSAT     = %8d.\n", p->nSatRunsUnsat );
    ABC_PRT( "Structural  ", p->timeStruct );
    ABC_PRT( "Simulation  ", p->timeSim );
    ABC_PRT( "Matrix      ", p->timeMatr );
    ABC_PRT( "Counting    ", p->timeCount );
    ABC_PRT( "Fraiging    ", p->timeFraig );
    ABC_PRT( "SAT         ", p->timeSat );
    ABC_PRT( "TOTAL       ", p->timeTotal );
}